

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.h
# Opt level: O2

int kputw(int c,kstring_t *s)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  size_t __size;
  ulong uVar6;
  undefined8 uStack_30;
  char buf [16];
  
  uVar5 = (ulong)(uint)-c;
  if (0 < c) {
    uVar5 = (ulong)(uint)c;
  }
  uVar6 = 0;
  do {
    uVar4 = (uint)uVar5;
    buf[uVar6] = (byte)(uVar5 % 10) | 0x30;
    uVar6 = uVar6 + 1;
    uVar5 = uVar5 / 10;
  } while (9 < uVar4);
  if (c < 0) {
    uVar5 = uVar6 & 0xffffffff;
    uVar6 = (ulong)((int)uVar6 + 1);
    buf[uVar5] = '-';
  }
  uVar5 = s->l + (long)(int)uVar6 + 1;
  if (s->m <= uVar5) {
    uVar5 = uVar5 >> 1 | uVar5;
    uVar5 = uVar5 >> 2 | uVar5;
    uVar5 = uVar5 >> 4 | uVar5;
    uVar5 = uVar5 >> 8 | uVar5;
    __size = (uVar5 >> 0x10 | uVar5) + 1;
    s->m = __size;
    uStack_30 = 0x12e657;
    pcVar3 = (char *)realloc(s->s,__size);
    if (pcVar3 == (char *)0x0) goto LAB_0012e68c;
    s->s = pcVar3;
  }
  for (uVar6 = uVar6 & 0xffffffff; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
    cVar1 = buf[uVar6 - 1];
    sVar2 = s->l;
    s->l = sVar2 + 1;
    s->s[sVar2] = cVar1;
  }
  pcVar3 = (char *)s->l;
  s->s[(long)pcVar3] = '\0';
LAB_0012e68c:
  return (int)pcVar3;
}

Assistant:

static inline int kputw(int c, kstring_t *s)
{
	char buf[16];
	int i, l = 0;
	unsigned int x = c;
	if (c < 0) x = -x;
	do { buf[l++] = x%10 + '0'; x /= 10; } while (x > 0);
	if (c < 0) buf[l++] = '-';
	if (s->l + l + 1 >= s->m) {
		char *tmp;
		s->m = s->l + l + 2;
		kroundup32(s->m);
		if ((tmp = (char*)realloc(s->s, s->m)))
			s->s = tmp;
		else
			return EOF;
	}
	for (i = l - 1; i >= 0; --i) s->s[s->l++] = buf[i];
	s->s[s->l] = 0;
	return 0;
}